

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MergePrefixLists(Fts5Index *p,Fts5Buffer *p1,Fts5Buffer *p2)

{
  int iVar1;
  u8 *a;
  u8 *a_00;
  undefined1 local_d0 [8];
  Fts5PoslistWriter writer;
  i64 iPrev;
  u8 *aCopy;
  int nCopy;
  u8 *a2;
  u8 *a1;
  int iOff2;
  int iOff1;
  i64 iPos2;
  i64 iPos1;
  Fts5Buffer tmp;
  Fts5Buffer out;
  Fts5DoclistIter i2;
  Fts5DoclistIter i1;
  i64 iLastRowid;
  Fts5Buffer *p2_local;
  Fts5Buffer *p1_local;
  Fts5Index *p_local;
  
  if (p2->n != 0) {
    i1.nPoslist = 0;
    i1.nSize = 0;
    memset(&tmp.n,0,0x10);
    memset(&iPos1,0,0x10);
    iVar1 = sqlite3Fts5BufferSize(&p->rc,(Fts5Buffer *)&tmp.n,p1->n + p2->n + 9);
    if (iVar1 == 0) {
      fts5DoclistIterInit(p1,(Fts5DoclistIter *)&i2.nPoslist);
      fts5DoclistIterInit(p2,(Fts5DoclistIter *)&out.n);
      do {
        while ((long)i2.aEof <= (long)i1.aEof) {
          if (i2.aEof == i1.aEof) {
            iPos2 = 0;
            _iOff2 = 0;
            a1._4_4_ = 0;
            a1._0_4_ = 0;
            a = (u8 *)(i1.iRowid + i1.aPoslist._4_4_);
            a_00 = (u8 *)(i2.iRowid + i2.aPoslist._4_4_);
            writer.iPrev = 0;
            memset(local_d0,0,8);
            iVar1 = sqlite3Fts5PutVarint
                              ((uchar *)(tmp._8_8_ + (long)(int)out.p),(long)i2.aEof - i1._24_8_);
            i1._24_8_ = i2.aEof;
            out.p._0_4_ = iVar1 + (int)out.p;
            sqlite3Fts5BufferZero((Fts5Buffer *)&iPos1);
            sqlite3Fts5BufferSize(&p->rc,(Fts5Buffer *)&iPos1,(int)i1.aPoslist + (int)i2.aPoslist);
            if (p->rc != 0) goto LAB_001fb20c;
            sqlite3Fts5PoslistNext64(a,(int)i1.aPoslist,(int *)((long)&a1 + 4),&iPos2);
            sqlite3Fts5PoslistNext64(a_00,(int)i2.aPoslist,(int *)&a1,(i64 *)&iOff2);
            if (iPos2 < _iOff2) {
              sqlite3Fts5PoslistSafeAppend((Fts5Buffer *)&iPos1,&writer.iPrev,iPos2);
              sqlite3Fts5PoslistNext64(a,(int)i1.aPoslist,(int *)((long)&a1 + 4),&iPos2);
            }
            else {
              sqlite3Fts5PoslistSafeAppend((Fts5Buffer *)&iPos1,&writer.iPrev,_iOff2);
              sqlite3Fts5PoslistNext64(a_00,(int)i2.aPoslist,(int *)&a1,(i64 *)&iOff2);
            }
            if (-1 < iPos2) {
              while (-1 < _iOff2) {
                while (iPos2 < _iOff2) {
                  if (iPos2 != writer.iPrev) {
                    sqlite3Fts5PoslistSafeAppend((Fts5Buffer *)&iPos1,&writer.iPrev,iPos2);
                  }
                  sqlite3Fts5PoslistNext64(a,(int)i1.aPoslist,(int *)((long)&a1 + 4),&iPos2);
                  if (iPos2 < 0) goto LAB_001fb0d7;
                }
                sqlite3Fts5PoslistSafeAppend((Fts5Buffer *)&iPos1,&writer.iPrev,_iOff2);
                sqlite3Fts5PoslistNext64(a_00,(int)i2.aPoslist,(int *)&a1,(i64 *)&iOff2);
              }
            }
LAB_001fb0d7:
            if (iPos2 < 0) {
              sqlite3Fts5PoslistSafeAppend((Fts5Buffer *)&iPos1,&writer.iPrev,_iOff2);
              iPrev = (i64)(a_00 + (int)a1);
              aCopy._4_4_ = (int)i2.aPoslist - (int)a1;
            }
            else {
              if (iPos2 != writer.iPrev) {
                sqlite3Fts5PoslistSafeAppend((Fts5Buffer *)&iPos1,&writer.iPrev,iPos2);
              }
              iPrev = (i64)(a + a1._4_4_);
              aCopy._4_4_ = (int)i1.aPoslist - a1._4_4_;
            }
            if (0 < aCopy._4_4_) {
              memcpy((void *)(iPos1 + (int)tmp.p),(void *)iPrev,(long)aCopy._4_4_);
              tmp.p._0_4_ = aCopy._4_4_ + (int)tmp.p;
            }
            iVar1 = sqlite3Fts5PutVarint
                              ((uchar *)(tmp._8_8_ + (long)(int)out.p),(long)((int)tmp.p << 1));
            out.p._0_4_ = iVar1 + (int)out.p;
            memcpy((void *)(tmp._8_8_ + (long)(int)out.p),(void *)iPos1,(long)(int)tmp.p);
            out.p._0_4_ = (int)tmp.p + (int)out.p;
            fts5DoclistIterNext((Fts5DoclistIter *)&i2.nPoslist);
            fts5DoclistIterNext((Fts5DoclistIter *)&out.n);
            if (i1.iRowid == 0) goto LAB_001fb20c;
          }
          else {
            iVar1 = sqlite3Fts5PutVarint
                              ((uchar *)(tmp._8_8_ + (long)(int)out.p),(long)i2.aEof - i1._24_8_);
            i1._24_8_ = i2.aEof;
            out.p._0_4_ = iVar1 + (int)out.p;
            memcpy((void *)(tmp._8_8_ + (long)(int)out.p),(void *)i2.iRowid,
                   (long)((int)i2.aPoslist + i2.aPoslist._4_4_));
            out.p._0_4_ = (int)i2.aPoslist + i2.aPoslist._4_4_ + (int)out.p;
            fts5DoclistIterNext((Fts5DoclistIter *)&out.n);
          }
          if (i2.iRowid == 0) goto LAB_001fb20c;
        }
        iVar1 = sqlite3Fts5PutVarint
                          ((uchar *)(tmp._8_8_ + (long)(int)out.p),(long)i1.aEof - i1._24_8_);
        out.p._0_4_ = iVar1 + (int)out.p;
        i1._24_8_ = i1.aEof;
        memcpy((void *)(tmp._8_8_ + (long)(int)out.p),(void *)i1.iRowid,
               (long)((int)i1.aPoslist + i1.aPoslist._4_4_));
        out.p._0_4_ = (int)i1.aPoslist + i1.aPoslist._4_4_ + (int)out.p;
        fts5DoclistIterNext((Fts5DoclistIter *)&i2.nPoslist);
      } while (i1.iRowid != 0);
LAB_001fb20c:
      if (i1.iRowid == 0) {
        if (i2.iRowid != 0) {
          iVar1 = sqlite3Fts5PutVarint
                            ((uchar *)(tmp._8_8_ + (long)(int)out.p),(long)i2.aEof - i1._24_8_);
          out.p._0_4_ = iVar1 + (int)out.p;
          memcpy((void *)(tmp._8_8_ + (long)(int)out.p),(void *)i2.iRowid,out._8_8_ - i2.iRowid);
          out.p._0_4_ = (int)out.p + (out.n - (int)i2.iRowid);
        }
      }
      else {
        iVar1 = sqlite3Fts5PutVarint
                          ((uchar *)(tmp._8_8_ + (long)(int)out.p),(long)i1.aEof - i1._24_8_);
        out.p._0_4_ = iVar1 + (int)out.p;
        memcpy((void *)(tmp._8_8_ + (long)(int)out.p),(void *)i1.iRowid,i2._24_8_ - i1.iRowid);
        out.p._0_4_ = (int)out.p + (i2.nPoslist - (int)i1.iRowid);
      }
      sqlite3Fts5BufferSet(&p->rc,p1,(int)out.p,(u8 *)tmp._8_8_);
      sqlite3Fts5BufferFree((Fts5Buffer *)&iPos1);
      sqlite3Fts5BufferFree((Fts5Buffer *)&tmp.n);
    }
  }
  return;
}

Assistant:

static void fts5MergePrefixLists(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Buffer *p1,                 /* First list to merge */
  Fts5Buffer *p2                  /* Second list to merge */
){
  if( p2->n ){
    i64 iLastRowid = 0;
    Fts5DoclistIter i1;
    Fts5DoclistIter i2;
    Fts5Buffer out = {0, 0, 0};
    Fts5Buffer tmp = {0, 0, 0};

    /* The maximum size of the output is equal to the sum of the two 
    ** input sizes + 1 varint (9 bytes). The extra varint is because if the
    ** first rowid in one input is a large negative number, and the first in
    ** the other a non-negative number, the delta for the non-negative
    ** number will be larger on disk than the literal integer value
    ** was.  */
    if( sqlite3Fts5BufferSize(&p->rc, &out, p1->n + p2->n + 9) ) return;
    fts5DoclistIterInit(p1, &i1);
    fts5DoclistIterInit(p2, &i2);

    while( 1 ){
      if( i1.iRowid<i2.iRowid ){
        /* Copy entry from i1 */
        fts5MergeAppendDocid(&out, iLastRowid, i1.iRowid);
        fts5BufferSafeAppendBlob(&out, i1.aPoslist, i1.nPoslist+i1.nSize);
        fts5DoclistIterNext(&i1);
        if( i1.aPoslist==0 ) break;
      }
      else if( i2.iRowid!=i1.iRowid ){
        /* Copy entry from i2 */
        fts5MergeAppendDocid(&out, iLastRowid, i2.iRowid);
        fts5BufferSafeAppendBlob(&out, i2.aPoslist, i2.nPoslist+i2.nSize);
        fts5DoclistIterNext(&i2);
        if( i2.aPoslist==0 ) break;
      }
      else{
        /* Merge the two position lists. */ 
        i64 iPos1 = 0;
        i64 iPos2 = 0;
        int iOff1 = 0;
        int iOff2 = 0;
        u8 *a1 = &i1.aPoslist[i1.nSize];
        u8 *a2 = &i2.aPoslist[i2.nSize];
        int nCopy;
        u8 *aCopy;

        i64 iPrev = 0;
        Fts5PoslistWriter writer;
        memset(&writer, 0, sizeof(writer));

        fts5MergeAppendDocid(&out, iLastRowid, i2.iRowid);
        fts5BufferZero(&tmp);
        sqlite3Fts5BufferSize(&p->rc, &tmp, i1.nPoslist + i2.nPoslist);
        if( p->rc ) break;

        sqlite3Fts5PoslistNext64(a1, i1.nPoslist, &iOff1, &iPos1);
        sqlite3Fts5PoslistNext64(a2, i2.nPoslist, &iOff2, &iPos2);
        assert( iPos1>=0 && iPos2>=0 );

        if( iPos1<iPos2 ){
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos1);
          sqlite3Fts5PoslistNext64(a1, i1.nPoslist, &iOff1, &iPos1);
        }else{
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos2);
          sqlite3Fts5PoslistNext64(a2, i2.nPoslist, &iOff2, &iPos2);
        }

        if( iPos1>=0 && iPos2>=0 ){
          while( 1 ){
            if( iPos1<iPos2 ){
              if( iPos1!=iPrev ){
                sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos1);
              }
              sqlite3Fts5PoslistNext64(a1, i1.nPoslist, &iOff1, &iPos1);
              if( iPos1<0 ) break;
            }else{
              assert_nc( iPos2!=iPrev );
              sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos2);
              sqlite3Fts5PoslistNext64(a2, i2.nPoslist, &iOff2, &iPos2);
              if( iPos2<0 ) break;
            }
          }
        }

        if( iPos1>=0 ){
          if( iPos1!=iPrev ){
            sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos1);
          }
          aCopy = &a1[iOff1];
          nCopy = i1.nPoslist - iOff1;
        }else{
          assert( iPos2>=0 && iPos2!=iPrev );
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos2);
          aCopy = &a2[iOff2];
          nCopy = i2.nPoslist - iOff2;
        }
        if( nCopy>0 ){
          fts5BufferSafeAppendBlob(&tmp, aCopy, nCopy);
        }

        /* WRITEPOSLISTSIZE */
        fts5BufferSafeAppendVarint(&out, tmp.n * 2);
        fts5BufferSafeAppendBlob(&out, tmp.p, tmp.n);
        fts5DoclistIterNext(&i1);
        fts5DoclistIterNext(&i2);
        assert( out.n<=(p1->n+p2->n+9) );
        if( i1.aPoslist==0 || i2.aPoslist==0 ) break;
      }
    }

    if( i1.aPoslist ){
      fts5MergeAppendDocid(&out, iLastRowid, i1.iRowid);
      fts5BufferSafeAppendBlob(&out, i1.aPoslist, i1.aEof - i1.aPoslist);
    }
    else if( i2.aPoslist ){
      fts5MergeAppendDocid(&out, iLastRowid, i2.iRowid);
      fts5BufferSafeAppendBlob(&out, i2.aPoslist, i2.aEof - i2.aPoslist);
    }
    assert( out.n<=(p1->n+p2->n+9) );

    fts5BufferSet(&p->rc, p1, out.n, out.p);
    fts5BufferFree(&tmp);
    fts5BufferFree(&out);
  }
}